

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void SQCompilation::StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm)

{
  SQCOMPILERERROR p_Var1;
  undefined8 uVar2;
  _Rb_tree_node_base *p_Var3;
  iterator iVar4;
  iterator iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  int32_t i;
  ulong uVar9;
  long lVar10;
  string message;
  
  p_Var1 = vm->_sharedstate->_compilererrorhandler;
  if (p_Var1 != (SQCOMPILERERROR)0x0) {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    for (p_Var3 = (_Rb_tree_node_base *)declaredGlobals_abi_cxx11_._24_8_;
        p_Var6 = (_Rb_tree_node_base *)usedGlobals_abi_cxx11_._24_8_,
        p_Var3 != (_Rb_tree_node_base *)(declaredGlobals_abi_cxx11_ + 8);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      lVar8 = *(long *)(p_Var3 + 2);
      p_Var7 = p_Var3[2]._M_parent;
      if ((long)p_Var7 - lVar8 != 0x18) {
        uVar2 = *(undefined8 *)(p_Var3 + 1);
        lVar10 = 0x10;
        for (uVar9 = 0; uVar9 < (ulong)(((long)p_Var7 - lVar8) / 0x18); uVar9 = uVar9 + 1) {
          if (*(char *)(lVar8 + lVar10) == '\0') {
            message._M_string_length = 0;
            *message._M_dataplus._M_p = '\0';
            SQCompilationContext::renderDiagnosticHeader(DI_GLOBAL_NAME_REDEF,&message,uVar2);
            (*p_Var1)(vm,SEV_WARNING,message._M_dataplus._M_p,*(SQChar **)(lVar8 + -0x10 + lVar10),
                      (long)*(int *)(lVar8 + -8 + lVar10),(long)*(int *)(lVar8 + -4 + lVar10),"\n");
            lVar8 = *(long *)(p_Var3 + 2);
            p_Var7 = p_Var3[2]._M_parent;
          }
          lVar10 = lVar10 + 0x18;
        }
      }
    }
    for (; p_Var6 != (_Rb_tree_node_base *)(usedGlobals_abi_cxx11_ + 8);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      p_Var3 = p_Var6 + 1;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)knownBindings_abi_cxx11_,(key_type *)p_Var3);
      if ((iVar4.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur == (__node_type *)0x0) &&
         (iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                          *)declaredGlobals_abi_cxx11_,(key_type *)p_Var3),
         iVar5._M_node == (_Base_ptr)(declaredGlobals_abi_cxx11_ + 8))) {
        lVar8 = 0x10;
        for (uVar9 = 0; lVar10 = *(long *)(p_Var6 + 2),
            uVar9 < (ulong)(((long)p_Var6[2]._M_parent - lVar10) / 0x18); uVar9 = uVar9 + 1) {
          if (*(char *)(lVar10 + lVar8) == '\0') {
            message._M_string_length = 0;
            *message._M_dataplus._M_p = '\0';
            SQCompilationContext::renderDiagnosticHeader
                      (DI_UNDEFINED_GLOBAL,&message,*(undefined8 *)p_Var3);
            (*p_Var1)(vm,SEV_WARNING,message._M_dataplus._M_p,*(SQChar **)(lVar10 + -0x10 + lVar8),
                      (long)*(int *)(lVar10 + -8 + lVar8),(long)*(int *)(lVar10 + -4 + lVar8),"\n");
          }
          lVar8 = lVar8 + 0x18;
        }
      }
    }
    std::__cxx11::string::~string((string *)&message);
  }
  return;
}

Assistant:

void StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm) {
  auto errorFunc = _ss(vm)->_compilererrorhandler;

  if (!errorFunc)
    return;

  // 1. Check multiple declarations

  std::string message;

  for (auto it = declaredGlobals.begin(); it != declaredGlobals.end(); ++it) {
    const SQChar *name = it->first.c_str();
    const auto &declarations = it->second;

    if (declarations.size() == 1)
      continue;

    for (int32_t i = 0; i < declarations.size(); ++i) {
      const IdLocation &loc = declarations[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_GLOBAL_NAME_REDEF, &message, name);
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }

  // 2. Check undefined usages

  for (auto it = usedGlobals.begin(); it != usedGlobals.end(); ++it) {
    const std::string &id = it->first;

    bool isKnownBinding = knownBindings.find(id) != knownBindings.end();
    if (isKnownBinding)
      continue;

    if (declaredGlobals.find(id) != declaredGlobals.end())
      continue;

    const auto &usages = it->second;

    for (int32_t i = 0; i < usages.size(); ++i) {
      const IdLocation &loc = usages[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_UNDEFINED_GLOBAL, &message, id.c_str());
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }
}